

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rasm.c
# Opt level: O0

char * GetPath(char *filename)

{
  int iVar1;
  size_t sVar2;
  bool bVar3;
  int local_18;
  int idx;
  int zelen;
  char *filename_local;
  
  sVar2 = strlen(filename);
  local_18 = (int)sVar2;
  do {
    iVar1 = local_18;
    local_18 = iVar1 + -1;
    bVar3 = false;
    if (-1 < local_18) {
      bVar3 = filename[local_18] != '/';
    }
  } while (bVar3);
  if (local_18 < 0) {
    strcpy(GetPath::curpath,"./");
  }
  else {
    strcpy(GetPath::curpath,filename);
    GetPath::curpath[iVar1] = '\0';
  }
  return GetPath::curpath;
}

Assistant:

char *GetPath(char *filename) {
	#undef FUNC
	#define FUNC "GetPath"

	static char curpath[PATH_MAX];
	int zelen,idx;

	zelen=strlen(filename);

#ifdef OS_WIN
	#define CURRENT_DIR ".\\"

	TxtReplace(filename,"/","\\",1);
	idx=zelen-1;
	while (idx>=0 && filename[idx]!='\\') idx--;
	if (idx<0) {
		/* pas de chemin */
		strcpy(curpath,".\\");
	} else {
		/* chemin trouve */
		strcpy(curpath,filename);
		curpath[idx+1]=0;
	}
#else
#ifdef __MORPHOS__
	#define CURRENT_DIR ""
#else
	#define CURRENT_DIR "./"
#endif
	idx=zelen-1;
	while (idx>=0 && filename[idx]!='/') idx--;
	if (idx<0) {
		/* pas de chemin */
		strcpy(curpath,CURRENT_DIR);
	} else {
		/* chemin trouve */
		strcpy(curpath,filename);
		curpath[idx+1]=0;
	}
#endif

	return curpath;
}